

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

void EncodeSetOrSequenceOf<RevocationInfoChoice>
               (DerType type,vector<RevocationInfoChoice,_std::allocator<RevocationInfoChoice>_> *in
               ,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  out_of_range *this;
  ulong uVar4;
  code *pcVar5;
  size_t sVar6;
  undefined *puVar7;
  ulong uVar8;
  size_t local_38;
  size_t cbInternal;
  
  local_38 = 0;
  if (*(long *)(in + 8) == *(long *)in) {
    if (cbOut < 2) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                ((overflow_error *)this,"Overflow in EncodeSetOrSequenceOf");
      puVar7 = &std::overflow_error::typeinfo;
      pcVar5 = std::overflow_error::~overflow_error;
      goto LAB_00124bc6;
    }
    pOut[0] = '\x05';
    pOut[1] = '\0';
    sVar6 = 2;
  }
  else {
    *pOut = (uchar)type;
    sVar2 = GetDataSize<RevocationInfoChoice>(in);
    sVar6 = 2;
    if (sVar2 != 0) {
      sVar6 = sVar2;
    }
    bVar1 = EncodeSize(sVar6,pOut + 1,cbOut - 1,&local_38);
    if (!bVar1) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"Error in EncodeSize");
      puVar7 = &std::out_of_range::typeinfo;
      pcVar5 = std::out_of_range::~out_of_range;
LAB_00124bc6:
      __cxa_throw(this,puVar7,pcVar5);
    }
    sVar6 = local_38 + 1;
    lVar3 = *(long *)in;
    if (*(long *)(in + 8) != lVar3) {
      uVar4 = 0;
      uVar8 = 1;
      do {
        AnyType::Encode((AnyType *)(lVar3 + uVar4 * 0x40 + 0x10),pOut + sVar6,cbOut - sVar6,
                        &local_38);
        sVar6 = sVar6 + local_38;
        lVar3 = *(long *)in;
        bVar1 = uVar8 < (ulong)(*(long *)(in + 8) - lVar3 >> 6);
        uVar4 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar1);
    }
  }
  *cbUsed = sVar6;
  return;
}

Assistant:

void EncodeSetOrSequenceOf(DerType type, std::vector<T>& in, unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
	size_t cbInternal = 0;
	size_t offset = 0;

	if (in.size() == 0)
	{
		if (cbOut < 2)
			throw std::overflow_error("Overflow in EncodeSetOrSequenceOf");

		pOut[0] = static_cast<unsigned char>(DerType::Null);
		pOut[1] = 0;
		cbUsed = 2;
		return;
	}

	pOut[0] = static_cast<unsigned char>(type);

	size_t cbVector = GetEncodedSize(in);

	offset = 1;
	if (!EncodeSize(cbVector, pOut + offset, cbOut - offset, cbInternal))
		throw std::out_of_range("Error in EncodeSize");

	offset += cbInternal;

	for (unsigned int i = 0; i < in.size(); ++i)
	{
		in[i].Encode(pOut + offset, cbOut - offset, cbInternal);
		offset += cbInternal;
	}

	cbUsed = offset;
}